

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

char * kj::_::fill<kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
                 (char *target,FixedArray<char,_1UL> *first,StringTree *rest,
                 FixedArray<char,_1UL> *rest_1)

{
  char *pcVar1;
  
  *target = first->content[0];
  pcVar1 = fill<kj::FixedArray<char,1ul>>(target + 1,rest,rest_1);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}